

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O3

int kinLs_AccessLMem(void *kinmem,char *fname,KINMem *kin_mem,KINLsMem *kinls_mem)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "KINSOL memory is NULL.";
    iVar1 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
  }
  else {
    *kin_mem = (KINMem)kinmem;
    if (*(KINLsMem *)((long)kinmem + 0x1f8) != (KINLsMem)0x0) {
      *kinls_mem = *(KINLsMem *)((long)kinmem + 0x1f8);
      return 0;
    }
    msgfmt = "Linear solver memory is NULL.";
    iVar1 = -2;
    error_code = -2;
  }
  KINProcessError((KINMem)kinmem,error_code,"KINLS",fname,msgfmt);
  return iVar1;
}

Assistant:

int kinLs_AccessLMem(void* kinmem, const char *fname,
                     KINMem *kin_mem, KINLsMem *kinls_mem)
{
  if (kinmem==NULL) {
    KINProcessError(NULL, KINLS_MEM_NULL, "KINLS",
                    fname, MSG_LS_KINMEM_NULL);
    return(KINLS_MEM_NULL);
  }
  *kin_mem = (KINMem) kinmem;
  if ((*kin_mem)->kin_lmem==NULL) {
    KINProcessError(*kin_mem, KINLS_LMEM_NULL, "KINLS",
                    fname, MSG_LS_LMEM_NULL);
    return(KINLS_LMEM_NULL);
  }
  *kinls_mem = (KINLsMem) (*kin_mem)->kin_lmem;
  return(KINLS_SUCCESS);
}